

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

bool __thiscall
xscript::parser::ast::parse_import_declaration
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent)

{
  bool bVar1;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  _Alloc_hider _Var2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  string local_40;
  
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,IMPORT_DECLARATION);
  if ((this->cur_token).type == TK_IMPORT) {
    next(this);
    bVar1 = parse_package_name(this,parent_00);
    if (!bVar1) {
      return false;
    }
    if (((this->cur_token).type == TK_AS) && (bVar1 = parse_package_rename(this,parent_00), !bVar1))
    {
      return false;
    }
    if ((this->cur_token).type == TK_SEMICOLON) {
      next(this);
      return true;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"build_O1/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
    local_70._M_len = 0x25;
    local_70._M_str = "expected \';\' after import declaration";
    args_00._M_len = 1;
    args_00._M_array = &local_70;
    append_syntax_error(this,&local_40,0x104,args_00);
    local_60.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
    _Var2._M_p = local_40._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return false;
    }
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"build_O1/src/CMakeFiles/xscript.dir/compiler_depend.ts","");
    local_70._M_len = 0x1d;
    local_70._M_str = "<import declaration> expected";
    args._M_len = 1;
    args._M_array = &local_70;
    process_failover(this,&local_60,0xf5,args,true);
    _Var2._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return false;
    }
  }
  operator_delete(_Var2._M_p,local_60.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool ast::parse_import_declaration(std::unique_ptr<ast_node>& parent) {
    std::unique_ptr<ast_node>& node = parent->add_child(IMPORT_DECLARATION);

    if (cur_token != tokenizer::TK_IMPORT) {
        return failover({"<import declaration> expected"});
    }
    next();

    if (!parse_package_name(node)) {
        return false;
    }

    if (cur_token == tokenizer::TK_AS) {
        if (!parse_package_rename(node)) {
            return false;
        }
    }

    if (cur_token != tokenizer::TK_SEMICOLON) {
        return syntax_error({"expected ';' after import declaration"});
    }
    next();

    return true;
}